

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV extractObjectInformation
                (CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_CLASS *objClass,
                CK_KEY_TYPE *keyType,CK_CERTIFICATE_TYPE *certType,CK_BBOOL *isOnToken,
                CK_BBOOL *isPrivate,bool bImplicit)

{
  CK_ATTRIBUTE_TYPE CVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bKeyTypeRequired;
  CK_ULONG i;
  bool bHasPrivate;
  bool bHasCertType;
  bool bHasKeyType;
  bool bHasClass;
  bool bImplicit_local;
  CK_BBOOL *isOnToken_local;
  CK_CERTIFICATE_TYPE *certType_local;
  CK_KEY_TYPE *keyType_local;
  CK_OBJECT_CLASS *objClass_local;
  CK_ULONG ulCount_local;
  CK_ATTRIBUTE_PTR pTemplate_local;
  CK_RV local_8;
  
  bVar5 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  for (i = 0; i < ulCount; i = i + 1) {
    CVar1 = pTemplate[i].type;
    if (CVar1 == 0) {
      if (pTemplate[i].ulValueLen == 8) {
        *objClass = *pTemplate[i].pValue;
        bVar5 = true;
      }
    }
    else if (CVar1 == 1) {
      if (pTemplate[i].ulValueLen == 1) {
        *isOnToken = *pTemplate[i].pValue;
      }
    }
    else if (CVar1 == 2) {
      if (pTemplate[i].ulValueLen == 1) {
        *isPrivate = *pTemplate[i].pValue;
        bVar4 = true;
      }
    }
    else if (CVar1 == 0x80) {
      if (pTemplate[i].ulValueLen == 8) {
        *certType = *pTemplate[i].pValue;
        bVar3 = true;
      }
    }
    else if ((CVar1 == 0x100) && (pTemplate[i].ulValueLen == 8)) {
      *keyType = *pTemplate[i].pValue;
      bVar2 = true;
    }
  }
  if (bImplicit) {
    local_8 = 0;
  }
  else if (bVar5) {
    bVar5 = true;
    if ((*objClass != 2) && (bVar5 = true, *objClass != 3)) {
      bVar5 = *objClass == 4;
    }
    if ((!bVar5) || (bVar2)) {
      if (*objClass == 1) {
        if (!bVar3) {
          return 0xd0;
        }
        if (!bVar4) {
          *isPrivate = '\0';
        }
      }
      if ((*objClass == 2) && (!bVar4)) {
        *isPrivate = '\0';
      }
      local_8 = 0;
    }
    else {
      local_8 = 0xd0;
    }
  }
  else {
    local_8 = 0xd0;
  }
  return local_8;
}

Assistant:

static CK_RV extractObjectInformation(CK_ATTRIBUTE_PTR pTemplate,
				      CK_ULONG ulCount,
				      CK_OBJECT_CLASS &objClass,
				      CK_KEY_TYPE &keyType,
				      CK_CERTIFICATE_TYPE &certType,
				      CK_BBOOL &isOnToken,
				      CK_BBOOL &isPrivate,
				      bool bImplicit)
{
	bool bHasClass = false;
	bool bHasKeyType = false;
	bool bHasCertType = false;
	bool bHasPrivate = false;

	// Extract object information
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
				if (pTemplate[i].ulValueLen == sizeof(CK_OBJECT_CLASS))
				{
					objClass = *(CK_OBJECT_CLASS_PTR)pTemplate[i].pValue;
					bHasClass = true;
				}
				break;
			case CKA_KEY_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_KEY_TYPE))
				{
					keyType = *(CK_KEY_TYPE*)pTemplate[i].pValue;
					bHasKeyType = true;
				}
				break;
			case CKA_CERTIFICATE_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_CERTIFICATE_TYPE))
				{
					certType = *(CK_CERTIFICATE_TYPE*)pTemplate[i].pValue;
					bHasCertType = true;
				}
				break;
			case CKA_TOKEN:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
				}
				break;
			case CKA_PRIVATE:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
					bHasPrivate = true;
				}
				break;
			default:
				break;
		}
	}

	if (bImplicit)
	{
		return CKR_OK;
	}

	if (!bHasClass)
	{
		return CKR_TEMPLATE_INCOMPLETE;
	}

	bool bKeyTypeRequired = (objClass == CKO_PUBLIC_KEY || objClass == CKO_PRIVATE_KEY || objClass == CKO_SECRET_KEY);
	if (bKeyTypeRequired && !bHasKeyType)
	{
		 return CKR_TEMPLATE_INCOMPLETE;
	}

	if (objClass == CKO_CERTIFICATE)
	{
		if (!bHasCertType)
		{
			return CKR_TEMPLATE_INCOMPLETE;
		}
		if (!bHasPrivate)
		{
			// Change default value for certificates
			isPrivate = CK_FALSE;
		}
	}

	if (objClass == CKO_PUBLIC_KEY && !bHasPrivate)
	{
		// Change default value for public keys
		isPrivate = CK_FALSE;
	}

	return CKR_OK;
}